

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_acl_nfs4.c
# Opt level: O1

void set_acls(archive_entry *ae,acl_t *acls,int n)

{
  long lVar1;
  
  archive_entry_acl_clear(ae);
  if (0 < n) {
    lVar1 = 0;
    do {
      archive_entry_acl_add_entry
                (ae,*(wchar_t *)((long)&acls->type + lVar1),
                 *(wchar_t *)((long)&acls->permset + lVar1),*(wchar_t *)((long)&acls->tag + lVar1),
                 *(wchar_t *)((long)&acls->qual + lVar1),*(char **)((long)&acls->name + lVar1));
      lVar1 = lVar1 + 0x18;
    } while ((ulong)(uint)n * 0x18 != lVar1);
  }
  return;
}

Assistant:

static void
set_acls(struct archive_entry *ae, struct acl_t *acls, int n)
{
	int i;

	archive_entry_acl_clear(ae);
	for (i = 0; i < n; i++) {
		failure("type=%d, permset=%d, tag=%d, qual=%d name=%s",
		    acls[i].type, acls[i].permset, acls[i].tag,
		    acls[i].qual, acls[i].name);
		assertEqualInt(ARCHIVE_OK,
		    archive_entry_acl_add_entry(ae,
			acls[i].type, acls[i].permset, acls[i].tag,
			acls[i].qual, acls[i].name));
	}
}